

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_23::Heap2LocalPass::doWalkFunction(Heap2LocalPass *this,Function *func)

{
  Expression **currp;
  Id IVar1;
  Module *module;
  StructNew *pSVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  undefined8 *puVar5;
  LazyLocalGraph *pLVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  pointer ppSVar9;
  Block *__code;
  undefined1 auVar10 [8];
  bool bVar11;
  bool bVar12;
  Index index;
  PassOptions *pPVar13;
  LocalSet *left;
  mapped_type *pmVar14;
  _Hash_node_base *p_Var15;
  __node_ptr __node;
  HeapType right;
  undefined1 auVar16 [8];
  char *pcVar17;
  ulong uVar18;
  code *type;
  pointer pTVar19;
  StructNew *curr;
  pointer pTVar20;
  Type in_R8;
  pointer __ptr;
  __node_base_ptr p_Var21;
  uint uVar22;
  __node_base_ptr p_Var23;
  Module *pMVar24;
  optional<wasm::Type> type_00;
  Struct2Local local_a50;
  Function *local_928;
  Module *local_920;
  PassOptions *local_918;
  LazyLocalGraph local_910;
  undefined1 local_7a0 [328];
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_658;
  undefined1 local_620 [264];
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  local_518;
  undefined1 auStack_4e8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> gets;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_490;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3b8;
  undefined1 auStack_378 [8];
  AllocationFinder finder;
  undefined1 local_260 [8];
  EscapeAnalyzer analyzer;
  undefined1 auStack_1b8 [8];
  EscapeAnalyzer analyzer_1;
  pointer pTStack_100;
  _Alloc_hider local_c8;
  Type local_c0;
  HeapType local_b8;
  bool local_b0;
  Index local_ac;
  Block *local_a8;
  Block *local_a0;
  undefined1 auStack_98 [8];
  Field element;
  undefined1 auStack_78 [8];
  FieldList fields;
  HeapType arrayType;
  
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>
           .currModule;
  pPVar13 = &((this->
              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Heap2LocalPass,_wasm::Visitor<wasm::(anonymous_namespace)::Heap2LocalPass,_void>_>_>
              ).super_Pass.runner)->options;
  local_928 = func;
  local_920 = module;
  local_918 = pPVar13;
  LazyLocalGraph::LazyLocalGraph(&local_910,func,module,(optional<wasm::Expression::Id>)0x0);
  Parents::Parents((Parents *)local_7a0,func->body);
  currp = &func->body;
  BranchUtils::BranchTargets::BranchTargets((BranchTargets *)local_620,*currp);
  auStack_378 = (undefined1  [8])0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
       (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currFunction =
       (Function *)0x0;
  finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule = (Module *)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  finder.arrayNews.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  type = PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::scan;
  Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
            ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)auStack_378,
             PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::scan,currp);
  if (((long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
             super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
             super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed.
             _M_elems[9].currp >> 4) +
      (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
            super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep != 0) {
    do {
      if ((pointer)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
          super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
            super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep ==
            (Expression **)0x0) {
          pcVar17 = 
          "T &wasm::SmallVector<wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, 10>::back() [T = wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, N = 10]"
          ;
LAB_008c0cb3:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar17);
        }
        pTVar19 = (pointer)&finder.
                            super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                            .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                            stack.fixed._M_elems
                            [(long)finder.
                                   super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                                   .
                                   super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar19 = finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                  super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                  flexible.
                  super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      type = (code *)pTVar19->currp;
      if ((pointer)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
          super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
            super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep ==
            (Expression **)0x0) {
          pcVar17 = 
          "void wasm::SmallVector<wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, 10>::pop_back() [T = wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::Task, N = 10]"
          ;
LAB_008c0c94:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,pcVar17);
        }
        finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
        super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep =
             (Expression **)
             ((long)finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep
             + -1);
      }
      else {
        finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
        super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
             super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_378 = (undefined1  [8])type;
      if (*(Expression **)type == (Expression *)0x0) {
        pcVar17 = 
        "void wasm::Walker<AllocationFinder, wasm::Visitor<AllocationFinder>>::walk(Expression *&) [SubType = AllocationFinder, VisitorType = wasm::Visitor<AllocationFinder>]"
        ;
LAB_008c0c75:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar17);
      }
      (*pTVar19->func)((AllocationFinder *)auStack_378,(Expression **)type);
    } while (((long)finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    flexible.
                    super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    fixed._M_elems[9].currp >> 4) +
             (long)finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                   .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.replacep
             != 0);
  }
  p_Var21 = (__node_base_ptr)
            CONCAT71(finder.arrayNews.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     finder.arrayNews.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_1_);
  if ((__node_base_ptr)
      finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == p_Var21) {
    bVar12 = false;
  }
  else {
    bVar12 = false;
    p_Var23 = (__node_base_ptr)
              finder.structNews.
              super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    analyzer.reachedInteractions._M_h._M_single_bucket = p_Var21;
    do {
      pSVar2 = (StructNew *)p_Var23->_M_nxt;
      bVar11 = Heap2Local::canHandleAsLocals
                         ((Heap2Local *)
                          (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                          super_Expression.type.id,(Type)type);
      if (bVar11) {
        local_260 = (undefined1  [8])&local_910;
        analyzer.localGraph = (LazyLocalGraph *)local_7a0;
        analyzer.parents = (Parents *)local_620;
        analyzer.wasm = (Module *)&analyzer.sets._M_h._M_rehash_policy._M_next_resize;
        analyzer.sets._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer.sets._M_h._M_bucket_count = 0;
        analyzer.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer.sets._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer.sets._M_h._M_rehash_policy._4_4_ = 0;
        analyzer.sets._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer.sets._M_h._M_single_bucket =
             (__node_base_ptr)&analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize;
        analyzer.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
        analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
        curr = pSVar2;
        analyzer.branchTargets = (BranchTargets *)pPVar13;
        analyzer.passOptions = (PassOptions *)module;
        bVar11 = EscapeAnalyzer::escapes((EscapeAnalyzer *)local_260,(Expression *)pSVar2);
        if (!bVar11) {
          auStack_1b8 = (undefined1  [8])0x0;
          analyzer_1.localGraph = (LazyLocalGraph *)0x0;
          pTStack_100 = (pointer)0x0;
          local_c0.id = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                        super_Expression.type.id;
          local_b8.id = 0x10;
          local_b0 = false;
          IVar1 = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id;
          local_c8._M_p = (pointer)module;
          if (IVar1 == ArrayNewFixedId) {
            local_ac = (Index)(pSVar2->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .usedElements;
          }
          else {
            if (IVar1 != ArrayNewId) {
              handle_unreachable("bad allocation",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                 ,0x4f1);
            }
            local_ac = Array2Struct::getIndex
                                 ((Array2Struct *)
                                  (pSVar2->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  .usedElements,(Expression *)curr);
          }
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)wasm::Type::getHeapType
                                  (&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                                    super_Expression.type);
          HeapType::getArray((HeapType *)auStack_4e8);
          auStack_98 = auStack_4e8;
          element.type.id =
               (uintptr_t)
               gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
          auStack_78 = (undefined1  [8])0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (local_ac != 0) {
            uVar22 = 0;
            do {
              if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Field,std::allocator<wasm::Field>>::
                _M_realloc_insert<wasm::Field_const&>
                          ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_78,
                           (iterator)
                           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start,(Field *)auStack_98);
              }
              else {
                ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start)->type).id = (uintptr_t)auStack_98;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->packedType = (undefined4)element.type.id;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->mutable_ = element.type.id._4_4_;
                fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_start =
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < local_ac);
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_4e8,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_78);
          HeapType::HeapType(&arrayType,(Struct *)auStack_4e8);
          local_b8.id = arrayType.id;
          if (auStack_4e8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_4e8,
                            (long)gets.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_4e8);
          }
          IVar1 = (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id;
          if (IVar1 == ArrayNewFixedId) {
            local_a8 = (Block *)Builder::makeStructNew<ArenaVector<wasm::Expression*>>
                                          ((Builder *)&local_c8,local_b8,&pSVar2->operands);
            local_a0 = local_a8;
          }
          else {
            if (IVar1 != ArrayNewId) {
              handle_unreachable("bad allocation",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                                 ,0x435);
            }
            if ((pSVar2->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data ==
                (Expression **)0x0) {
              local_a8 = (Block *)Builder::makeStructNew
                                            ((Builder *)&local_c8,local_b8,
                                             (initializer_list<wasm::Expression_*>)ZEXT816(0));
              local_a0 = local_a8;
            }
            else {
              auVar8._8_8_ = 0;
              auVar8._0_8_ = auStack_98;
              auVar16 = auStack_98;
              index = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar8 << 0x40),in_R8);
              left = Builder::makeLocalSet
                               ((Builder *)&local_c8,index,
                                (Expression *)
                                (pSVar2->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                .data);
              auStack_4e8 = (undefined1  [8])0x0;
              gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              if (local_ac != 0) {
                uVar22 = 0;
                do {
                  auVar10 = auStack_98;
                  arrayType.id = (uintptr_t)
                                 MixedArena::allocSpace
                                           ((MixedArena *)(local_c8._M_p + 0x200),0x18,8);
                  *(undefined1 *)arrayType.id = 8;
                  *(Index *)(arrayType.id + 0x10) = index;
                  *(undefined1 (*) [8])(arrayType.id + 8) = auVar10;
                  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                  emplace_back<wasm::Expression*>
                            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                             auStack_4e8,(Expression **)&arrayType);
                  uVar22 = uVar22 + 1;
                } while (uVar22 < local_ac);
              }
              local_a8 = (Block *)Builder::
                                  makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                                            ((Builder *)&local_c8,local_b8,
                                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                              *)auStack_4e8);
              in_R8.id = 0;
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)auVar16;
              local_a0 = Builder::makeSequence
                                   ((Builder *)&local_c8,(Expression *)left,(Expression *)local_a8,
                                    type_00);
              if (auStack_4e8 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_4e8,
                                (long)gets.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_4e8
                               );
              }
            }
          }
          pmVar14 = std::
                    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                    ::operator[]((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                                  *)&analyzer.sets._M_h._M_single_bucket,(key_type *)&local_a0);
          __code = local_a8;
          *pmVar14 = Flows;
          uVar18 = (ulong)local_a8 % (ulong)analyzer.reachedInteractions._M_h._M_buckets;
          p_Var3 = analyzer.sets._M_h._M_single_bucket[uVar18]._M_nxt;
          p_Var15 = (_Hash_node_base *)0x0;
          if ((p_Var3 != (_Hash_node_base *)0x0) &&
             (p_Var15 = p_Var3, p_Var4 = p_Var3->_M_nxt,
             local_a8 != (Block *)p_Var3->_M_nxt[1]._M_nxt)) {
            while (in_R8.id = (uintptr_t)p_Var4, p_Var4 = ((_Hash_node_base *)in_R8.id)->_M_nxt,
                  p_Var4 != (_Hash_node_base *)0x0) {
              p_Var15 = (_Hash_node_base *)0x0;
              if (((ulong)p_Var4[1]._M_nxt % (ulong)analyzer.reachedInteractions._M_h._M_buckets !=
                   uVar18) ||
                 (p_Var15 = (_Hash_node_base *)in_R8.id, local_a8 == (Block *)p_Var4[1]._M_nxt))
              goto LAB_008c0634;
            }
            p_Var15 = (_Hash_node_base *)0x0;
          }
LAB_008c0634:
          if (p_Var15 == (_Hash_node_base *)0x0) {
            __node = (__node_ptr)0x0;
          }
          else {
            __node = (__node_ptr)p_Var15->_M_nxt;
          }
          if (__node == (__node_ptr)0x0) {
            __node = (__node_ptr)operator_new(0x18);
            (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
            *(Block **)
             &(__node->
              super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
              ).
              super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
              ._M_storage._M_storage = __code;
            (__node->
            super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
            ).
            super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
            ._M_storage._M_storage.__data[8] = '\0';
            std::
            _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_insert_unique_node
                      ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&analyzer.sets._M_h._M_single_bucket,uVar18,(__hash_code)__code,__node,
                       in_R8.id);
          }
          p_Var21 = analyzer.reachedInteractions._M_h._M_single_bucket;
          (__node->
          super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
          ).
          super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>
          ._M_storage._M_storage.__data[8] = '\x02';
          for (puVar5 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
              puVar5 != (undefined8 *)0x0; puVar5 = (undefined8 *)*puVar5) {
            pcVar17 = (char *)puVar5[1];
            if ((*pcVar17 != '?') &&
               ((*(ulong *)(pcVar17 + 8) & 1) == 0 && 6 < *(ulong *)(pcVar17 + 8))) {
              right = wasm::Type::getHeapType((Type *)(pcVar17 + 8));
              bVar12 = HeapType::isSubType((HeapType)
                                           fields.
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,right)
              ;
              if (bVar12) {
                if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)right.id) {
                  local_b0 = true;
                }
                if (((uint)(0x7c < local_b8.id) * 4 + 3 & (uint)local_b8.id) != 0) {
                  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
                }
                uVar18 = *(ulong *)(puVar5[1] + 8);
                *(ulong *)(puVar5[1] + 8) =
                     (uint)(((uint)uVar18 & 3) == 2 && 6 < uVar18) * 2 | local_b8.id;
              }
            }
          }
          if (analyzer_1.localGraph != (LazyLocalGraph *)0x0) {
            __assert_fail("stack.size() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                          ,0x12d,
                          "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
                         );
          }
          Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
          ::pushTask((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                      *)auStack_1b8,
                     PostWalker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
                     ::scan,currp);
          while ((long)&((analyzer_1.localGraph)->super_LocalGraphBase).func +
                 ((long)pTStack_100 >> 4) != 0) {
            if (pTStack_100 == (pointer)0x0) {
              if (analyzer_1.localGraph == (LazyLocalGraph *)0x0) {
                pcVar17 = 
                "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, N = 10]"
                ;
                goto LAB_008c0cb3;
              }
              pTVar20 = (pointer)(auStack_1b8 + (long)analyzer_1.localGraph * 0x10);
            }
            else {
              pTVar20 = pTStack_100 + -1;
            }
            pLVar6 = (LazyLocalGraph *)pTVar20->currp;
            if (pTStack_100 == (pointer)0x0) {
              if (analyzer_1.localGraph == (LazyLocalGraph *)0x0) {
                pcVar17 = 
                "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::Task, N = 10]"
                ;
                goto LAB_008c0c94;
              }
              analyzer_1.localGraph =
                   (LazyLocalGraph *)
                   ((long)&analyzer_1.localGraph[-1].flower._M_t.
                           super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
                           .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl + 7)
              ;
            }
            else {
              pTStack_100 = pTStack_100 + -1;
            }
            auStack_1b8 = (undefined1  [8])pLVar6;
            if ((pLVar6->super_LocalGraphBase).func == (Function *)0x0) {
              pcVar17 = 
              "void wasm::Walker<wasm::(anonymous namespace)::Array2Struct, wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Array2Struct, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Array2Struct>]"
              ;
              goto LAB_008c0c75;
            }
            (*pTVar20->func)((Array2Struct *)auStack_1b8,(Expression **)pLVar6);
          }
          if (local_b0 == true) {
            ReFinalize::ReFinalize((ReFinalize *)auStack_4e8);
            local_490.currFunction = func;
            local_490.currModule = module;
            Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                      (&local_490,currp);
            local_490.currFunction = (Function *)0x0;
            local_490.currModule = (Module *)0x0;
            auStack_4e8 = (undefined1  [8])&PTR__ReFinalize_01090960;
            std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_3b8);
            if (local_490.stack.flexible.
                super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_490.stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_490.stack.flexible.
                                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_490.stack.flexible.
                                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            Pass::~Pass((Pass *)auStack_4e8);
          }
          if (auStack_78 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_78,
                            (long)fields.
                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
          }
          in_R8.id = (uintptr_t)module;
          Struct2Local::Struct2Local
                    (&local_a50,(StructNew *)local_a8,(EscapeAnalyzer *)local_260,func,module);
          if (local_a50.localIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a50.localIndexes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a50.localIndexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a50.localIndexes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar12 = true;
          if (local_a50.
              super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .stack.flexible.
              super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a50.
                            super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                            .
                            super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a50.
                                  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .
                                  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a50.
                                  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .
                                  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        puVar5 = (undefined8 *)analyzer.reachedInteractions._M_h._M_bucket_count;
        while (puVar5 != (undefined8 *)0x0) {
          puVar7 = (undefined8 *)*puVar5;
          operator_delete(puVar5,0x18);
          puVar5 = puVar7;
        }
        type = (code *)0x0;
        memset(analyzer.sets._M_h._M_single_bucket,0,
               (long)analyzer.reachedInteractions._M_h._M_buckets << 3);
        analyzer.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if ((__node_base_ptr)&analyzer.reachedInteractions._M_h._M_rehash_policy._M_next_resize !=
            analyzer.sets._M_h._M_single_bucket) {
          type = (code *)((long)analyzer.reachedInteractions._M_h._M_buckets << 3);
          operator_delete(analyzer.sets._M_h._M_single_bucket,(ulong)type);
        }
        std::
        _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&analyzer.wasm);
      }
      p_Var23 = p_Var23 + 1;
    } while (p_Var23 != p_Var21);
  }
  ppSVar9 = finder.structNews.
            super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule !=
      (Module *)
      finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pMVar24 = finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
              super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule;
    do {
      pSVar2 = (StructNew *)
               (pMVar24->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = Heap2Local::canHandleAsLocals
                         ((Heap2Local *)
                          (pSVar2->super_SpecificExpression<(wasm::Expression::Id)65>).
                          super_Expression.type.id,(Type)type);
      if (bVar11) {
        auStack_1b8 = (undefined1  [8])&local_910;
        analyzer_1.localGraph = (LazyLocalGraph *)local_7a0;
        analyzer_1.parents = (Parents *)local_620;
        analyzer_1.wasm = (Module *)&analyzer_1.sets._M_h._M_rehash_policy._M_next_resize;
        analyzer_1.sets._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer_1.sets._M_h._M_bucket_count = 0;
        analyzer_1.sets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer_1.sets._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer_1.sets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer_1.sets._M_h._M_rehash_policy._4_4_ = 0;
        analyzer_1.sets._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer_1.sets._M_h._M_single_bucket =
             (__node_base_ptr)&analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize;
        analyzer_1.reachedInteractions._M_h._M_buckets = (__buckets_ptr)0x1;
        analyzer_1.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer_1.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        analyzer_1.reachedInteractions._M_h._M_element_count._0_4_ = 0x3f800000;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._4_4_ = 0;
        analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize = 0;
        analyzer_1.branchTargets = (BranchTargets *)pPVar13;
        analyzer_1.passOptions = (PassOptions *)module;
        bVar11 = EscapeAnalyzer::escapes((EscapeAnalyzer *)auStack_1b8,(Expression *)pSVar2);
        puVar5 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
        if (!bVar11) {
          Struct2Local::Struct2Local
                    ((Struct2Local *)auStack_4e8,pSVar2,(EscapeAnalyzer *)auStack_1b8,func,module);
          if (local_490.stack.flexible.
              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_490.stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_490.stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_490.stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar12 = true;
          puVar5 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
          if ((pointer)local_490.stack.fixed._M_elems[4].currp != (pointer)0x0) {
            operator_delete(local_490.stack.fixed._M_elems[4].currp,
                            (long)local_490.stack.fixed._M_elems[5].currp -
                            (long)local_490.stack.fixed._M_elems[4].currp);
            puVar5 = (undefined8 *)analyzer_1.reachedInteractions._M_h._M_bucket_count;
          }
        }
        while (puVar5 != (undefined8 *)0x0) {
          puVar7 = (undefined8 *)*puVar5;
          operator_delete(puVar5,0x18);
          puVar5 = puVar7;
        }
        type = (code *)0x0;
        memset(analyzer_1.sets._M_h._M_single_bucket,0,
               (long)analyzer_1.reachedInteractions._M_h._M_buckets << 3);
        analyzer_1.reachedInteractions._M_h._M_bucket_count = 0;
        analyzer_1.reachedInteractions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if ((__node_base_ptr)&analyzer_1.reachedInteractions._M_h._M_rehash_policy._M_next_resize !=
            analyzer_1.sets._M_h._M_single_bucket) {
          type = (code *)((long)analyzer_1.reachedInteractions._M_h._M_buckets << 3);
          operator_delete(analyzer_1.sets._M_h._M_single_bucket,(ulong)type);
        }
        std::
        _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&analyzer_1.wasm);
      }
      pMVar24 = (Module *)
                &(pMVar24->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (pMVar24 != (Module *)ppSVar9);
  }
  if (((char)finder.arrayNews.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != '\0') && (bVar12)) {
    EHUtils::handleBlockNestedPops(func,module,SkipIfNoEH);
  }
  if (finder.structNews.super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(finder.structNews.
                    super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    CONCAT71(finder.arrayNews.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             finder.arrayNews.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_) -
                    (long)finder.structNews.
                          super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.currModule !=
      (Module *)0x0) {
    operator_delete(finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    currModule,
                    (long)finder.structNews.
                          super__Vector_base<wasm::StructNew_*,_std::allocator<wasm::StructNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          currModule);
  }
  if (finder.super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
      super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.fixed._M_elems[9]
      .currp != (Expression **)0x0) {
    operator_delete(finder.
                    super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                    super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.stack.
                    fixed._M_elems[9].currp,
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          stack.flexible.
                          super__Vector_base<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task,_std::allocator<wasm::Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)finder.
                          super_PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>
                          .super_Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>.
                          stack.fixed._M_elems[9].currp);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Expression_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Expression_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Expression_*>_>_>
               *)(local_620 + 0xd8));
  if ((pointer)local_620._176_8_ != (pointer)0x0) {
    operator_delete((void *)local_620._176_8_,local_620._192_8_ - local_620._176_8_);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_658);
  if ((pointer)local_7a0._304_8_ != (pointer)0x0) {
    operator_delete((void *)local_7a0._304_8_,local_7a0._320_8_ - local_7a0._304_8_);
  }
  if ((pointer)local_7a0._176_8_ != (pointer)0x0) {
    operator_delete((void *)local_7a0._176_8_,local_7a0._192_8_ - local_7a0._176_8_);
  }
  LazyLocalGraph::~LazyLocalGraph(&local_910);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // Multiple rounds of optimization may work in theory, as once we turn one
    // allocation into locals, references written to its fields become
    // references written to locals, which we may see do not escape. However,
    // this does not work yet, since we do not remove the original allocation -
    // we just "detach" it from other things and then depend on other
    // optimizations to remove it. That means this pass must be interleaved with
    // vacuum, in particular, to optimize such nested allocations.
    // TODO Consider running multiple iterations here, and running vacuum in
    //      between them.
    Heap2Local(func, *getModule(), getPassOptions());
  }